

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<long_long,_QList<QString>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<long_long,_QList<QString>_>_>::findNode<long_long>
          (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *this,longlong *key)

{
  long lVar1;
  bool bVar2;
  Node<long_long,_QList<QString>_> *pNVar3;
  longlong *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<long_long>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x2051bb);
  if (bVar2) {
    pNVar3 = (Node<long_long,_QList<QString>_> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x2051d6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }